

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O3

Directory * __thiscall
CompoundFile::File::directory(Directory *__return_storage_ptr__,File *this,wstring *name)

{
  wchar_t *__s2;
  _Base_ptr p_Var1;
  _Base_ptr __s1;
  int iVar2;
  _Base_ptr p_Var3;
  Exception *this_00;
  _Rb_tree_header *p_Var4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  p_Var3 = (this->m_dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_dirs)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    __s2 = (name->_M_dataplus)._M_p;
    p_Var1 = (_Base_ptr)name->_M_string_length;
    do {
      if (p_Var3[1]._M_left == p_Var1) {
        __s1 = p_Var3[1]._M_parent;
        if (p_Var1 == (_Base_ptr)0x0) {
LAB_0011a760:
          (__return_storage_ptr__->m_name)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_name).field_2;
          std::__cxx11::wstring::_M_construct<wchar_t*>
                    ((wstring *)__return_storage_ptr__,__s1,&__s1->_M_color + (long)p_Var1);
          *(_Base_ptr *)&__return_storage_ptr__->m_leftChild = p_Var3[2]._M_right;
          p_Var1 = p_Var3[2]._M_left;
          *(_Base_ptr *)&__return_storage_ptr__->m_type = p_Var3[2]._M_parent;
          *(_Base_ptr *)&__return_storage_ptr__->m_streamSize = p_Var1;
          return __return_storage_ptr__;
        }
        iVar2 = wmemcmp((wchar_t *)__s1,__s2,(size_t)p_Var1);
        if (iVar2 == 0) goto LAB_0011a760;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_70,L"There is no such directory : ",L"");
  std::operator+(&local_50,&local_70,name);
  Exception::Exception(this_00,&local_50);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline Directory
File::directory( const std::wstring & name ) const
{
	for( std::map< int32_t, Directory >::const_iterator it = m_dirs.begin(),
		last = m_dirs.end(); it != last; ++it )
	{
		if( it->second.name() == name )
			return it->second;
	}

	throw Exception( std::wstring( L"There is no such directory : " ) + name );
}